

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pageReinit(DbPage *pData)

{
  byte bVar1;
  u32 uVar2;
  MemPage *pPage;
  BtShared *pBVar3;
  u8 *puVar4;
  int iVar5;
  ushort uVar6;
  ulong uVar7;
  
  pPage = (MemPage *)pData->pExtra;
  if ((pPage->isInit != '\0') && (pPage->isInit = '\0', 1 < pData->nRef)) {
    pBVar3 = pPage->pBt;
    puVar4 = pPage->aData;
    uVar7 = (ulong)pPage->hdrOffset;
    iVar5 = decodeFlags(pPage,(uint)puVar4[uVar7]);
    if (iVar5 == 0) {
      uVar2 = pBVar3->pageSize;
      pPage->maskPage = (short)uVar2 - 1;
      pPage->nOverflow = '\0';
      bVar1 = pPage->childPtrSize;
      pPage->cellOffset = pPage->hdrOffset + 8 + (ushort)bVar1;
      pPage->aCellIdx = puVar4 + (ulong)bVar1 + uVar7 + 8;
      pPage->aDataEnd = pPage->aData + pBVar3->usableSize;
      pPage->aDataOfst = pPage->aData + bVar1;
      uVar6 = *(ushort *)(puVar4 + uVar7 + 3) << 8 | *(ushort *)(puVar4 + uVar7 + 3) >> 8;
      pPage->nCell = uVar6;
      if ((uint)uVar6 <= (uVar2 - 8) / 6) {
        pPage->nFree = -1;
        pPage->isInit = '\x01';
        if ((pBVar3->db->flags & 0x200000) == 0) {
          return;
        }
        btreeCellSizeCheck(pPage);
        return;
      }
      iVar5 = 0xfeaf;
    }
    else {
      iVar5 = 0xfea1;
    }
    sqlite3CorruptError(iVar5);
    return;
  }
  return;
}

Assistant:

static void pageReinit(DbPage *pData){
  MemPage *pPage;
  pPage = (MemPage *)sqlite3PagerGetExtra(pData);
  assert( sqlite3PagerPageRefcount(pData)>0 );
  if( pPage->isInit ){
    assert( sqlite3_mutex_held(pPage->pBt->mutex) );
    pPage->isInit = 0;
    if( sqlite3PagerPageRefcount(pData)>1 ){
      /* pPage might not be a btree page;  it might be an overflow page
      ** or ptrmap page or a free page.  In those cases, the following
      ** call to btreeInitPage() will likely return SQLITE_CORRUPT.
      ** But no harm is done by this.  And it is very important that
      ** btreeInitPage() be called on every btree page so we make
      ** the call for every page that comes in for re-initing. */
      btreeInitPage(pPage);
    }
  }
}